

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space.h
# Opt level: O0

ScalarReferenceFiniteElement<double> * __thiscall
projects::dpg::ProductUniformFESpace<double>::ShapeFunctionLayout
          (ProductUniformFESpace<double> *this,RefEl ref_el_type,size_type component)

{
  RefElType RVar1;
  __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var2;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  ProductUniformFESpace<double> *pPStack_20;
  size_type component_local;
  ProductUniformFESpace<double> *this_local;
  element_type *peStack_10;
  RefEl ref_el_type_local;
  
  local_24 = component;
  pPStack_20 = this;
  this_local._7_1_ = ref_el_type.type_;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 7));
  switch(RVar1) {
  case kPoint:
    p_Var2 = &std::
              vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
              ::operator[](&this->rfs_point_v_,(ulong)local_24)->
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
    ;
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var2);
    break;
  case kSegment:
    p_Var2 = &std::
              vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
              ::operator[](&this->rfs_edge_v_,(ulong)local_24)->
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
    ;
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var2);
    break;
  case kTria:
    p_Var2 = &std::
              vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
              ::operator[](&this->rfs_tria_v_,(ulong)local_24)->
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
    ;
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var2);
    break;
  case kQuad:
    p_Var2 = &std::
              vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
              ::operator[](&this->rfs_quad_v_,(ulong)local_24)->
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
    ;
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var2);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"Illegal entity type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"false",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x175,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x175,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  return peStack_10;
}

Assistant:

lf::fe::ScalarReferenceFiniteElement<SCALAR> const *
ProductUniformFESpace<SCALAR>::ShapeFunctionLayout(lf::base::RefEl ref_el_type,
                                                   size_type component) const {
  // Retrive specification of local shape functions for
  // a certain component.
  switch (ref_el_type) {
    case lf::base::RefEl::kPoint(): {
      return rfs_point_v_[component].get();
    }
    case lf::base::RefEl::kSegment(): {
      // Null pointer valid return value:
      // indicates that a shape function description for edges is missing
      return rfs_edge_v_[component].get();
    }
    case lf::base::RefEl::kTria(): {
      // Null pointer valid return value:
      // indicates that a shape function description for triangles is missing.
      return rfs_tria_v_[component].get();
    }
    case lf::base::RefEl::kQuad(): {
      // Null pointer valid return value:
      // indicates that a shape function description for quadrilaterals is
      // missing.
      return rfs_quad_v_[component].get();
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal entity type");
    }
  }
  return nullptr;
}